

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_iterator.cpp
# Opt level: O3

void __thiscall
duckdb::TupleDataChunkIterator::TupleDataChunkIterator
          (TupleDataChunkIterator *this,TupleDataCollection *collection_p,
          TupleDataPinProperties properties,idx_t chunk_idx_from,idx_t chunk_idx_to,bool init_heap_p
          )

{
  pointer pTVar1;
  pointer *ppTVar2;
  long lVar3;
  idx_t iVar4;
  ulong uVar5;
  idx_t iVar6;
  
  this->collection = collection_p;
  this->init_heap = init_heap_p;
  *(undefined1 (*) [16])
   &(this->state).pin_state.row_handles.handles.
    super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
    .
    super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
    ._M_impl.super__Vector_impl_data = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->state).pin_state.row_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&(this->state).pin_state.heap_handles.handles.
           super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           .
           super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
           ._M_impl + 8) = (undefined1  [16])0x0;
  (this->state).pin_state.properties = INVALID;
  TupleDataChunkState::TupleDataChunkState(&(this->state).chunk_state);
  *(undefined4 *)&(this->state).segment_index = 0xffffffff;
  *(undefined4 *)((long)&(this->state).segment_index + 4) = 0xffffffff;
  *(undefined4 *)&(this->state).chunk_index = 0xffffffff;
  *(undefined4 *)((long)&(this->state).chunk_index + 4) = 0xffffffff;
  (this->state).pin_state.properties = properties;
  pTVar1 = (this->collection->segments).
           super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->collection->segments).
                super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
                super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 4) * 0x2e8ba2e8ba2e8ba3;
    ppTVar2 = (pointer *)((long)&pTVar1->chunks + 8);
    uVar5 = 0;
    iVar4 = 0;
    do {
      if ((uVar5 <= chunk_idx_from) &&
         (chunk_idx_from <=
          ((long)*ppTVar2 - (long)((_Vector_impl_data *)(ppTVar2 + -1))->_M_start >> 3) *
          -0x3333333333333333 + uVar5)) {
        this->start_segment_idx = iVar4;
        this->start_chunk_idx = chunk_idx_from - uVar5;
      }
      iVar6 = chunk_idx_to - uVar5;
      if (chunk_idx_to < uVar5) {
        uVar5 = ((long)*ppTVar2 - (long)((_Vector_impl_data *)(ppTVar2 + -1))->_M_start >> 3) *
                -0x3333333333333333 + uVar5;
      }
      else {
        uVar5 = ((long)*ppTVar2 - (long)((_Vector_impl_data *)(ppTVar2 + -1))->_M_start >> 3) *
                -0x3333333333333333 + uVar5;
        if (chunk_idx_to <= uVar5) {
          this->end_segment_idx = iVar4;
          this->end_chunk_idx = iVar6;
        }
      }
      iVar4 = iVar4 + 1;
      ppTVar2 = ppTVar2 + 0x16;
    } while (lVar3 + (ulong)(lVar3 == 0) != iVar4);
  }
  Reset(this);
  return;
}

Assistant:

TupleDataChunkIterator::TupleDataChunkIterator(TupleDataCollection &collection_p, TupleDataPinProperties properties,
                                               idx_t chunk_idx_from, idx_t chunk_idx_to, bool init_heap_p)
    : collection(collection_p), init_heap(init_heap_p) {
	state.pin_state.properties = properties;
	D_ASSERT(chunk_idx_from < chunk_idx_to);
	D_ASSERT(chunk_idx_to <= collection.ChunkCount());
	idx_t overall_chunk_index = 0;
	for (idx_t segment_idx = 0; segment_idx < collection.segments.size(); segment_idx++) {
		const auto &segment = collection.segments[segment_idx];
		if (chunk_idx_from >= overall_chunk_index && chunk_idx_from <= overall_chunk_index + segment.ChunkCount()) {
			// We start in this segment
			start_segment_idx = segment_idx;
			start_chunk_idx = chunk_idx_from - overall_chunk_index;
		}
		if (chunk_idx_to >= overall_chunk_index && chunk_idx_to <= overall_chunk_index + segment.ChunkCount()) {
			// We end in this segment
			end_segment_idx = segment_idx;
			end_chunk_idx = chunk_idx_to - overall_chunk_index;
		}
		overall_chunk_index += segment.ChunkCount();
	}

	Reset();
}